

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gog.cpp
# Opt level: O0

string * gog::(anonymous_namespace)::get_verb_abi_cxx11_(extract_options *o)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  char *verb;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *__s;
  
  __s = "inspect";
  if ((in_RSI->_M_string_length & 1) == 0) {
    if ((in_RSI->field_0x7 & 1) == 0) {
      if ((in_RSI->field_0x6 & 1) != 0) {
        __s = "list the contents of";
      }
    }
    else {
      __s = "test";
    }
  }
  else {
    __s = "extract";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RSI,__s,in_stack_ffffffffffffffe0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe7);
  return in_RDI;
}

Assistant:

std::string get_verb(const extract_options & o) {
	const char * verb = "inspect";
	if(o.extract) {
		verb = "extract";
	} else if(o.test) {
		verb = "test";
	} else if(o.list) {
		verb = "list the contents of";
	}
	return verb;
}